

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
yy::mylanguage_parser::yypush_(mylanguage_parser *this,char *m,stack_symbol_type *sym)

{
  ostream *poVar1;
  stack_symbol_type *sym_local;
  char *m_local;
  mylanguage_parser *this_local;
  
  if ((m != (char *)0x0) && (this->yydebug_ != 0)) {
    poVar1 = std::operator<<(this->yycdebug_,m);
    std::operator<<(poVar1,' ');
    yy_print_<yy::mylanguage_parser::by_state>
              (this,this->yycdebug_,&sym->super_basic_symbol<yy::mylanguage_parser::by_state>);
    std::operator<<(this->yycdebug_,'\n');
  }
  stack<yy::mylanguage_parser::stack_symbol_type,_std::vector<yy::mylanguage_parser::stack_symbol_type,_std::allocator<yy::mylanguage_parser::stack_symbol_type>_>_>
  ::push(&this->yystack_,sym);
  return;
}

Assistant:

void
  mylanguage_parser::yypush_ (const char* m, YY_MOVE_REF (stack_symbol_type) sym)
  {
    if (m)
      YY_SYMBOL_PRINT (m, sym);
    yystack_.push (YY_MOVE (sym));
  }